

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

void __thiscall basisu::priority_queue::down_heap(priority_queue *this,uint32_t heap_index)

{
  float fVar1;
  float fVar2;
  uint32_t uVar3;
  uint uVar4;
  entry *peVar5;
  entry *peVar6;
  ulong i;
  ulong i_00;
  
  peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,(ulong)heap_index);
  uVar3 = peVar5->m_index;
  peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,(ulong)heap_index);
  fVar1 = peVar5->m_priority;
  i = (ulong)heap_index;
  while( true ) {
    uVar4 = (int)i * 2;
    if (this->m_size < uVar4) break;
    i_00 = (ulong)uVar4;
    if (uVar4 < this->m_size) {
      peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,i_00);
      fVar2 = peVar5->m_priority;
      peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,(ulong)(uVar4 | 1));
      if (fVar2 < peVar5->m_priority) {
        i_00 = (ulong)(uVar4 | 1);
      }
    }
    peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,i_00);
    if (peVar5->m_priority <= fVar1 && fVar1 != peVar5->m_priority) break;
    peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,i_00);
    peVar6 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,i);
    *peVar6 = *peVar5;
    i = i_00;
  }
  peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,i);
  peVar5->m_index = uVar3;
  peVar5 = vector<basisu::priority_queue::entry>::operator[](&this->m_heap,i);
  peVar5->m_priority = fVar1;
  return;
}

Assistant:

inline void down_heap(uint32_t heap_index)
		{
			uint32_t orig_index = m_heap[heap_index].m_index;
			const float orig_priority = m_heap[heap_index].m_priority;

			uint32_t child_index;
			while ((child_index = (heap_index << 1)) <= m_size)
			{
				if ((child_index < m_size) && (m_heap[child_index].m_priority < m_heap[child_index + 1].m_priority)) ++child_index;
				if (orig_priority > m_heap[child_index].m_priority)
					break;
				m_heap[heap_index] = m_heap[child_index];
				heap_index = child_index;
			}

			m_heap[heap_index].m_index = orig_index;
			m_heap[heap_index].m_priority = orig_priority;
		}